

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall
HighsLpRelaxation::LpRow::get
          (LpRow *this,HighsMipSolver *mipsolver,HighsInt *len,HighsInt **inds,double **vals)

{
  HighsInt *in_RCX;
  undefined8 in_RDX;
  HighsMipSolverData *in_RSI;
  int *in_RDI;
  HighsInt **in_R8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  HighsInt row;
  
  row = (HighsInt)((ulong)in_RDX >> 0x20);
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x602d63)
    ;
    HighsMipSolverData::getRow
              (in_RSI,row,in_RCX,in_R8,(double **)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  else if (iVar1 == 1) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x602d2e)
    ;
    HighsCutPool::getCut
              ((HighsCutPool *)in_RSI,row,in_RCX,in_R8,
               (double **)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void HighsLpRelaxation::LpRow::get(const HighsMipSolver& mipsolver,
                                   HighsInt& len, const HighsInt*& inds,
                                   const double*& vals) const {
  switch (origin) {
    case kCutPool:
      mipsolver.mipdata_->cutpool.getCut(index, len, inds, vals);
      break;
    case kModel:
      mipsolver.mipdata_->getRow(index, len, inds, vals);
  };
}